

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_bid(archive_read *a,int best_bid)

{
  int iVar1;
  void *pvVar2;
  char *buff;
  ssize_t bytes_avail;
  ssize_t window;
  ssize_t offset;
  char *p;
  archive_read *paStack_18;
  int best_bid_local;
  archive_read *a_local;
  
  if (best_bid < 0x1f) {
    p._4_4_ = best_bid;
    paStack_18 = a;
    offset = (ssize_t)__archive_read_ahead(a,7,(ssize_t *)0x0);
    if ((void *)offset == (void *)0x0) {
      a_local._4_4_ = -1;
    }
    else {
      iVar1 = memcmp((void *)offset,"Rar!\x1a\a",7);
      if (iVar1 == 0) {
        a_local._4_4_ = 0x1e;
      }
      else if (((*(char *)offset == 'M') && (*(char *)(offset + 1) == 'Z')) ||
              (*(int *)offset == 0x464c457f)) {
        window = 0x10000;
        bytes_avail = 0x1000;
        do {
          while( true ) {
            if (0x20000 < window + bytes_avail) goto LAB_0014428b;
            pvVar2 = __archive_read_ahead(paStack_18,window + bytes_avail,(ssize_t *)&buff);
            if (pvVar2 == (void *)0x0) break;
            for (offset = (long)pvVar2 + window;
                (char *)(offset + 7U) < (char *)((long)pvVar2 + (long)buff); offset = offset + 0x10)
            {
              iVar1 = memcmp((void *)offset,"Rar!\x1a\a",7);
              if (iVar1 == 0) {
                return 0x1e;
              }
            }
            window = offset - (long)pvVar2;
          }
          bytes_avail = bytes_avail >> 1;
        } while (0x3f < bytes_avail);
        a_local._4_4_ = 0;
      }
      else {
LAB_0014428b:
        a_local._4_4_ = 0;
      }
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_rar_bid(struct archive_read *a, int best_bid)
{
  const char *p;

  /* If there's already a bid > 30, we'll never win. */
  if (best_bid > 30)
	  return (-1);

  if ((p = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (-1);

  if (memcmp(p, RAR_SIGNATURE, 7) == 0)
    return (30);

  if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
    /* This is a PE file */
    ssize_t offset = 0x10000;
    ssize_t window = 4096;
    ssize_t bytes_avail;
    while (offset + window <= (1024 * 128)) {
      const char *buff = __archive_read_ahead(a, offset + window, &bytes_avail);
      if (buff == NULL) {
        /* Remaining bytes are less than window. */
        window >>= 1;
        if (window < 0x40)
          return (0);
        continue;
      }
      p = buff + offset;
      while (p + 7 < buff + bytes_avail) {
        if (memcmp(p, RAR_SIGNATURE, 7) == 0)
          return (30);
        p += 0x10;
      }
      offset = p - buff;
    }
  }
  return (0);
}